

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O1

TIntermNode * __thiscall
glslang::HlslParseContext::addSwitch
          (HlslParseContext *this,TSourceLoc *loc,TIntermTyped *expression,
          TIntermAggregate *lastStatements,TAttributes *attributes)

{
  _List_node_base *p_Var1;
  TIntermediate *this_00;
  char cVar2;
  int iVar3;
  TIntermAggregate *in_RAX;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  TIntermBranch *node;
  TIntermAggregate *pTVar4;
  TPoolAllocator *pTVar5;
  undefined4 extraout_var_02;
  TIntermTyped *selection;
  TIntermAggregate *local_38;
  
  local_38 = in_RAX;
  wrapupSwitchSubsequence(this,lastStatements,(TIntermNode *)0x0);
  if (expression != (TIntermTyped *)0x0) {
    iVar3 = (*(expression->super_TIntermNode)._vptr_TIntermNode[0x20])(expression);
    if (iVar3 != 8) {
      iVar3 = (*(expression->super_TIntermNode)._vptr_TIntermNode[0x20])(expression);
      if (iVar3 != 9) goto LAB_00421b10;
    }
    iVar3 = (*(expression->super_TIntermNode)._vptr_TIntermNode[0x1e])(expression);
    cVar2 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0xe8))
                      ((long *)CONCAT44(extraout_var,iVar3));
    if (cVar2 == '\0') {
      iVar3 = (*(expression->super_TIntermNode)._vptr_TIntermNode[0x1e])(expression);
      cVar2 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar3) + 0xe0))
                        ((long *)CONCAT44(extraout_var_00,iVar3));
      if (cVar2 == '\0') {
        iVar3 = (*(expression->super_TIntermNode)._vptr_TIntermNode[0x1e])(expression);
        cVar2 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar3) + 0xd8))
                          ((long *)CONCAT44(extraout_var_01,iVar3));
        if (cVar2 == '\0') goto LAB_00421b37;
      }
    }
  }
LAB_00421b10:
  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
            (this,loc,"condition must be a scalar integer expression","switch","");
LAB_00421b37:
  p_Var1 = (this->super_TParseContextBase).switchSequenceStack.
           super_list<glslang::TVector<TIntermNode_*>_*,_glslang::pool_allocator<glslang::TVector<TIntermNode_*>_*>_>
           .
           super__List_base<glslang::TVector<TIntermNode_*>_*,_glslang::pool_allocator<glslang::TVector<TIntermNode_*>_*>_>
           ._M_impl._M_node.super__List_node_base._M_prev[1]._M_next;
  selection = expression;
  if (p_Var1[1]._M_next != p_Var1->_M_prev) {
    if (lastStatements == (TIntermAggregate *)0x0) {
      this_00 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
      node = TIntermediate::addBranch(this_00,EOpBreak,loc);
      pTVar4 = TIntermediate::makeAggregate(this_00,&node->super_TIntermNode);
      (*(pTVar4->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode[0x31]
      )(pTVar4,1);
      local_38 = pTVar4;
      std::vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>>::emplace_back<TIntermNode*>
                ((vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>> *)p_Var1,
                 (TIntermNode **)&local_38);
    }
    pTVar5 = GetThreadPoolAllocator();
    pTVar4 = (TIntermAggregate *)TPoolAllocator::allocate(pTVar5,0x188);
    TIntermAggregate::TIntermAggregate(pTVar4,EOpSequence);
    p_Var1 = (this->super_TParseContextBase).switchSequenceStack.
             super_list<glslang::TVector<TIntermNode_*>_*,_glslang::pool_allocator<glslang::TVector<TIntermNode_*>_*>_>
             .
             super__List_base<glslang::TVector<TIntermNode_*>_*,_glslang::pool_allocator<glslang::TVector<TIntermNode_*>_*>_>
             ._M_impl._M_node.super__List_node_base._M_prev[1]._M_next;
    iVar3 = (*(pTVar4->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
              [0x32])(pTVar4);
    std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator=
              ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
               CONCAT44(extraout_var_02,iVar3),
               (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)p_Var1);
    (*(pTVar4->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode[1])
              (pTVar4,loc);
    pTVar5 = GetThreadPoolAllocator();
    selection = (TIntermTyped *)TPoolAllocator::allocate(pTVar5,0x38);
    (selection->super_TIntermNode).loc.name = (TString *)0x0;
    (selection->super_TIntermNode).loc.string = 0;
    (selection->super_TIntermNode).loc.line = 0;
    (selection->super_TIntermNode).loc.column = 0;
    (selection->super_TIntermNode)._vptr_TIntermNode = (_func_int **)&PTR_getLoc_00b0fd98;
    (selection->type)._vptr_TType = (_func_int **)expression;
    *(TIntermAggregate **)&(selection->type).field_0x8 = pTVar4;
    *(undefined2 *)&(selection->type).qualifier.semanticName = 0;
    TIntermNode::setLoc((TIntermNode *)selection,loc);
    handleSwitchAttributes(this,loc,(TIntermSwitch *)selection,attributes);
  }
  return &selection->super_TIntermNode;
}

Assistant:

TIntermNode* HlslParseContext::addSwitch(const TSourceLoc& loc, TIntermTyped* expression,
                                         TIntermAggregate* lastStatements, const TAttributes& attributes)
{
    wrapupSwitchSubsequence(lastStatements, nullptr);

    if (expression == nullptr ||
        (expression->getBasicType() != EbtInt && expression->getBasicType() != EbtUint) ||
        expression->getType().isArray() || expression->getType().isMatrix() || expression->getType().isVector())
        error(loc, "condition must be a scalar integer expression", "switch", "");

    // If there is nothing to do, drop the switch but still execute the expression
    TIntermSequence* switchSequence = switchSequenceStack.back();
    if (switchSequence->size() == 0)
        return expression;

    if (lastStatements == nullptr) {
        // emulate a break for error recovery
        lastStatements = intermediate.makeAggregate(intermediate.addBranch(EOpBreak, loc));
        lastStatements->setOperator(EOpSequence);
        switchSequence->push_back(lastStatements);
    }

    TIntermAggregate* body = new TIntermAggregate(EOpSequence);
    body->getSequence() = *switchSequenceStack.back();
    body->setLoc(loc);

    TIntermSwitch* switchNode = new TIntermSwitch(expression, body);
    switchNode->setLoc(loc);
    handleSwitchAttributes(loc, switchNode, attributes);

    return switchNode;
}